

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall dlib::image_display::on_wheel_up(image_display *this,unsigned_long state)

{
  bool bVar1;
  ulong in_RSI;
  scrollable_region *in_RDI;
  point delta_1;
  point pix_loc_1;
  point mouse_loc_1;
  point delta;
  point pix_loc;
  point mouse_loc;
  scrollable_region *in_stack_fffffffffffffeb0;
  rectangle *in_stack_fffffffffffffeb8;
  vector<long,_2L> *in_stack_fffffffffffffec0;
  point *in_stack_fffffffffffffec8;
  rectangle *in_stack_fffffffffffffed0;
  unsigned_long in_stack_ffffffffffffff00;
  unsigned_long in_stack_ffffffffffffff08;
  scrollable_region *in_stack_ffffffffffffff10;
  rectangle *in_stack_ffffffffffffff98;
  scrollable_region *in_stack_ffffffffffffffa0;
  
  if ((in_RDI[1].total_rect_.b & 1) == 0) {
    if ((in_RSI & 0x10) == 0) {
      scrollable_region::on_wheel_up(in_stack_fffffffffffffeb0,(unsigned_long)in_RDI);
    }
    else {
      bVar1 = rectangle::contains(&(in_RDI->super_drawable).rect,*(in_RDI->super_drawable).lastx,
                                  *(in_RDI->super_drawable).lasty);
      if (((bVar1) && (((in_RDI->super_drawable).hidden & 1U) == 0)) &&
         (((in_RDI->super_drawable).enabled & 1U) != 0)) {
        if ((in_RDI[1].total_rect_.t < 100) && (in_RDI[1].total_rect_.r == 1)) {
          vector<long,_2L>::vector
                    (in_stack_fffffffffffffec0,(long)in_stack_fffffffffffffeb8,
                     (long)in_stack_fffffffffffffeb0);
          scrollable_region::total_rect(in_RDI);
          rectangle::tl_corner(in_stack_fffffffffffffeb8);
          dlib::operator-(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
          vector<long,2l>::operator/
                    ((vector<long,_2L> *)in_stack_fffffffffffffeb8,(long *)in_stack_fffffffffffffeb0
                    );
          in_RDI[1].total_rect_.t = (in_RDI[1].total_rect_.t * 10) / 9 + 1;
          array2d<dlib::rgb_alpha_pixel,_dlib::memory_manager_stateless_kernel_1<char>_>::nc
                    ((array2d<dlib::rgb_alpha_pixel,_dlib::memory_manager_stateless_kernel_1<char>_>
                      *)(in_RDI + 1));
          array2d<dlib::rgb_alpha_pixel,_dlib::memory_manager_stateless_kernel_1<char>_>::nr
                    ((array2d<dlib::rgb_alpha_pixel,_dlib::memory_manager_stateless_kernel_1<char>_>
                      *)(in_RDI + 1));
          scrollable_region::set_total_rect_size
                    (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
          scrollable_region::total_rect(in_RDI);
          rectangle::tl_corner(in_stack_fffffffffffffeb8);
          dlib::operator*((vector<long,_2L> *)in_stack_fffffffffffffeb8,
                          (long *)in_stack_fffffffffffffeb0);
          dlib::operator-(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
          dlib::operator-(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
          scrollable_region::display_rect(in_RDI);
          translate_rect(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          scrollable_region::scroll_to_rect(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        }
        else if (in_RDI[1].total_rect_.r != 1) {
          vector<long,_2L>::vector
                    (in_stack_fffffffffffffec0,(long)in_stack_fffffffffffffeb8,
                     (long)in_stack_fffffffffffffeb0);
          scrollable_region::total_rect(in_RDI);
          rectangle::tl_corner(in_stack_fffffffffffffeb8);
          dlib::operator-(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
          dlib::operator*((vector<long,_2L> *)in_stack_fffffffffffffeb8,
                          (long *)in_stack_fffffffffffffeb0);
          in_RDI[1].total_rect_.r = (in_RDI[1].total_rect_.r * 9) / 10;
          if (in_RDI[1].total_rect_.r == 0) {
            in_RDI[1].total_rect_.r = 1;
          }
          array2d<dlib::rgb_alpha_pixel,_dlib::memory_manager_stateless_kernel_1<char>_>::nc
                    ((array2d<dlib::rgb_alpha_pixel,_dlib::memory_manager_stateless_kernel_1<char>_>
                      *)(in_RDI + 1));
          array2d<dlib::rgb_alpha_pixel,_dlib::memory_manager_stateless_kernel_1<char>_>::nr
                    ((array2d<dlib::rgb_alpha_pixel,_dlib::memory_manager_stateless_kernel_1<char>_>
                      *)(in_RDI + 1));
          scrollable_region::set_total_rect_size
                    (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
          scrollable_region::total_rect(in_RDI);
          rectangle::tl_corner(in_stack_fffffffffffffeb8);
          vector<long,2l>::operator/
                    ((vector<long,_2L> *)in_stack_fffffffffffffeb8,(long *)in_stack_fffffffffffffeb0
                    );
          dlib::operator-(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
          dlib::operator-(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
          scrollable_region::display_rect(in_RDI);
          translate_rect(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          scrollable_region::scroll_to_rect(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        }
      }
    }
  }
  return;
}

Assistant:

void image_display::
    on_wheel_up (
        unsigned long state
    )
    {
        // disable mouse wheel if the user is drawing a rectangle
        if (drawing_rect)
            return;

        // if CONTROL is not being held down
        if ((state & base_window::CONTROL) == 0)
        {
            scrollable_region::on_wheel_up(state);
            return;
        }

        if (rect.contains(lastx,lasty) == false || hidden || !enabled)
            return;


        if (zoom_in_scale < 100 && zoom_out_scale == 1)
        {
            const point mouse_loc(lastx, lasty);
            // the pixel in img that the mouse is over
            const point pix_loc = (mouse_loc - total_rect().tl_corner())/zoom_in_scale;

            zoom_in_scale = zoom_in_scale*10/9 + 1;

            set_total_rect_size(img.nc()*zoom_in_scale, img.nr()*zoom_in_scale);

            // make is to the pixel under the mouse doesn't move while we zoom
            const point delta = total_rect().tl_corner() - (mouse_loc - pix_loc*zoom_in_scale);
            scroll_to_rect(translate_rect(display_rect(), delta)); 
        }
        else if (zoom_out_scale != 1)
        {
            const point mouse_loc(lastx, lasty);
            // the pixel in img that the mouse is over
            const point pix_loc = (mouse_loc - total_rect().tl_corner())*zoom_out_scale;

            zoom_out_scale = zoom_out_scale*9/10;
            if (zoom_out_scale == 0)
                zoom_out_scale = 1;

            set_total_rect_size(img.nc()/zoom_out_scale, img.nr()/zoom_out_scale);

            // make is to the pixel under the mouse doesn't move while we zoom
            const point delta = total_rect().tl_corner() - (mouse_loc - pix_loc/zoom_out_scale);
            scroll_to_rect(translate_rect(display_rect(), delta)); 
        }
    }